

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qkmsdevice.cpp
# Opt level: O2

void __thiscall
QKmsDevice::enumerateProperties
          (QKmsDevice *this,drmModeObjectPropertiesPtr objProps,PropCallback callback)

{
  uint uVar1;
  unsigned_long_long __args_1;
  _drmModeProperty *__args;
  uint uVar2;
  bool bVar3;
  function<void_(_drmModeProperty_*,_unsigned_long_long)> *in_RDX;
  ulong uVar4;
  char *pcVar5;
  int i_2;
  ulong uVar6;
  int i;
  long lVar7;
  long in_FS_OFFSET;
  char local_58 [24];
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar4 = 0;
  do {
    if (objProps->count_props <= uVar4) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return;
      }
      __stack_chk_fail();
    }
    __args = (_drmModeProperty *)drmModeGetProperty(this->m_dri_fd,objProps->props[uVar4]);
    if (__args != (_drmModeProperty *)0x0) {
      __args_1 = objProps->prop_values[uVar4];
      qLcKmsDebug();
      if (((byte)qLcKmsDebug::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
        local_58[0] = '\x02';
        local_58[1] = '\0';
        local_58[2] = '\0';
        local_58[3] = '\0';
        local_58[4] = '\0';
        local_58[5] = '\0';
        local_58[6] = '\0';
        local_58[7] = '\0';
        local_58[8] = '\0';
        local_58[9] = '\0';
        local_58[10] = '\0';
        local_58[0xb] = '\0';
        local_58[0xc] = '\0';
        local_58[0xd] = '\0';
        local_58[0xe] = '\0';
        local_58[0xf] = '\0';
        local_58[0x10] = '\0';
        local_58[0x11] = '\0';
        local_58[0x12] = '\0';
        local_58[0x13] = '\0';
        local_58[0x14] = '\0';
        local_58[0x15] = '\0';
        local_58[0x16] = '\0';
        local_58[0x17] = '\0';
        local_40 = qLcKmsDebug::category.name;
        QMessageLogger::debug
                  (local_58,"  property %d: id = %u name = \'%s\'",uVar4 & 0xffffffff,
                   (ulong)__args->prop_id,__args->name);
      }
      uVar1 = __args->flags;
      uVar2 = uVar1 & 0xffc0;
      bVar3 = (uVar1 & 0xffc0) == 0x80;
      if (uVar2 == 0) {
        bVar3 = (char)uVar1 < '\0';
      }
      if (bVar3) {
        qLcKmsDebug();
        if (((byte)qLcKmsDebug::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0)
        {
          local_58[0] = '\x02';
          local_58[1] = '\0';
          local_58[2] = '\0';
          local_58[3] = '\0';
          local_58[4] = '\0';
          local_58[5] = '\0';
          local_58[6] = '\0';
          local_58[7] = '\0';
          local_58[8] = '\0';
          local_58[9] = '\0';
          local_58[10] = '\0';
          local_58[0xb] = '\0';
          local_58[0xc] = '\0';
          local_58[0xd] = '\0';
          local_58[0xe] = '\0';
          local_58[0xf] = '\0';
          local_58[0x10] = '\0';
          local_58[0x11] = '\0';
          local_58[0x12] = '\0';
          local_58[0x13] = '\0';
          local_58[0x14] = '\0';
          local_58[0x15] = '\0';
          local_58[0x16] = '\0';
          local_58[0x17] = '\0';
          local_40 = qLcKmsDebug::category.name;
          QMessageLogger::debug
                    (local_58,"  type is SIGNED_RANGE, value is %lld, possible values are:",__args_1
                    );
        }
        for (lVar7 = 0; lVar7 < __args->count_values; lVar7 = lVar7 + 1) {
          qLcKmsDebug();
          if (((byte)qLcKmsDebug::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) !=
              0) {
            local_58[0] = '\x02';
            local_58[1] = '\0';
            local_58[2] = '\0';
            local_58[3] = '\0';
            local_58[0x14] = '\0';
            local_58[0x15] = '\0';
            local_58[0x16] = '\0';
            local_58[0x17] = '\0';
            local_58[4] = '\0';
            local_58[5] = '\0';
            local_58[6] = '\0';
            local_58[7] = '\0';
            local_58[8] = '\0';
            local_58[9] = '\0';
            local_58[10] = '\0';
            local_58[0xb] = '\0';
            local_58[0xc] = '\0';
            local_58[0xd] = '\0';
            local_58[0xe] = '\0';
            local_58[0xf] = '\0';
            local_58[0x10] = '\0';
            local_58[0x11] = '\0';
            local_58[0x12] = '\0';
            local_58[0x13] = '\0';
            local_40 = qLcKmsDebug::category.name;
            QMessageLogger::debug(local_58,"    %lld",__args->values[lVar7]);
          }
        }
      }
      else if ((uVar1 & 0xffc2) == 2) {
        qLcKmsDebug();
        if (((byte)qLcKmsDebug::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0)
        {
          local_58[0] = '\x02';
          local_58[1] = '\0';
          local_58[2] = '\0';
          local_58[3] = '\0';
          local_58[4] = '\0';
          local_58[5] = '\0';
          local_58[6] = '\0';
          local_58[7] = '\0';
          local_58[8] = '\0';
          local_58[9] = '\0';
          local_58[10] = '\0';
          local_58[0xb] = '\0';
          local_58[0xc] = '\0';
          local_58[0xd] = '\0';
          local_58[0xe] = '\0';
          local_58[0xf] = '\0';
          local_58[0x10] = '\0';
          local_58[0x11] = '\0';
          local_58[0x12] = '\0';
          local_58[0x13] = '\0';
          local_58[0x14] = '\0';
          local_58[0x15] = '\0';
          local_58[0x16] = '\0';
          local_58[0x17] = '\0';
          local_40 = qLcKmsDebug::category.name;
          QMessageLogger::debug
                    (local_58,"  type is RANGE, value is %llu, possible values are:",__args_1);
        }
        for (lVar7 = 0; lVar7 < __args->count_values; lVar7 = lVar7 + 1) {
          qLcKmsDebug();
          if (((byte)qLcKmsDebug::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) !=
              0) {
            local_58[0] = '\x02';
            local_58[1] = '\0';
            local_58[2] = '\0';
            local_58[3] = '\0';
            local_58[0x14] = '\0';
            local_58[0x15] = '\0';
            local_58[0x16] = '\0';
            local_58[0x17] = '\0';
            local_58[4] = '\0';
            local_58[5] = '\0';
            local_58[6] = '\0';
            local_58[7] = '\0';
            local_58[8] = '\0';
            local_58[9] = '\0';
            local_58[10] = '\0';
            local_58[0xb] = '\0';
            local_58[0xc] = '\0';
            local_58[0xd] = '\0';
            local_58[0xe] = '\0';
            local_58[0xf] = '\0';
            local_58[0x10] = '\0';
            local_58[0x11] = '\0';
            local_58[0x12] = '\0';
            local_58[0x13] = '\0';
            local_40 = qLcKmsDebug::category.name;
            QMessageLogger::debug(local_58,"    %llu",__args->values[lVar7]);
          }
        }
      }
      else if ((uVar1 & 0xffc8) == 8) {
        qLcKmsDebug();
        if (((byte)qLcKmsDebug::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0)
        {
          local_58[0] = '\x02';
          local_58[1] = '\0';
          local_58[2] = '\0';
          local_58[3] = '\0';
          local_58[4] = '\0';
          local_58[5] = '\0';
          local_58[6] = '\0';
          local_58[7] = '\0';
          local_58[8] = '\0';
          local_58[9] = '\0';
          local_58[10] = '\0';
          local_58[0xb] = '\0';
          local_58[0xc] = '\0';
          local_58[0xd] = '\0';
          local_58[0xe] = '\0';
          local_58[0xf] = '\0';
          local_58[0x10] = '\0';
          local_58[0x11] = '\0';
          local_58[0x12] = '\0';
          local_58[0x13] = '\0';
          local_58[0x14] = '\0';
          local_58[0x15] = '\0';
          local_58[0x16] = '\0';
          local_58[0x17] = '\0';
          local_40 = qLcKmsDebug::category.name;
          QMessageLogger::debug
                    (local_58,"  type is ENUM, value is %llu, possible values are:",__args_1);
        }
        lVar7 = 8;
        for (uVar6 = 0; (long)uVar6 < (long)__args->count_enums; uVar6 = uVar6 + 1) {
          qLcKmsDebug();
          if (((byte)qLcKmsDebug::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) !=
              0) {
            local_58[0] = '\x02';
            local_58[1] = '\0';
            local_58[2] = '\0';
            local_58[3] = '\0';
            local_58[4] = '\0';
            local_58[5] = '\0';
            local_58[6] = '\0';
            local_58[7] = '\0';
            local_58[8] = '\0';
            local_58[9] = '\0';
            local_58[10] = '\0';
            local_58[0xb] = '\0';
            local_58[0xc] = '\0';
            local_58[0xd] = '\0';
            local_58[0xe] = '\0';
            local_58[0xf] = '\0';
            local_58[0x10] = '\0';
            local_58[0x11] = '\0';
            local_58[0x12] = '\0';
            local_58[0x13] = '\0';
            local_58[0x14] = '\0';
            local_58[0x15] = '\0';
            local_58[0x16] = '\0';
            local_58[0x17] = '\0';
            local_40 = qLcKmsDebug::category.name;
            QMessageLogger::debug
                      (local_58,"    enum %d: %s - %llu",uVar6 & 0xffffffff,
                       __args->enums->name + lVar7 + -8,
                       *(undefined8 *)(__args->enums->name + lVar7 + -0x10));
          }
          lVar7 = lVar7 + 0x28;
        }
      }
      else if ((uVar1 & 0xffe0) == 0x20) {
        qLcKmsDebug();
        if (((byte)qLcKmsDebug::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0)
        {
          local_58[0] = '\x02';
          local_58[1] = '\0';
          local_58[2] = '\0';
          local_58[3] = '\0';
          local_58[4] = '\0';
          local_58[5] = '\0';
          local_58[6] = '\0';
          local_58[7] = '\0';
          local_58[8] = '\0';
          local_58[9] = '\0';
          local_58[10] = '\0';
          local_58[0xb] = '\0';
          local_58[0xc] = '\0';
          local_58[0xd] = '\0';
          local_58[0xe] = '\0';
          local_58[0xf] = '\0';
          local_58[0x10] = '\0';
          local_58[0x11] = '\0';
          local_58[0x12] = '\0';
          local_58[0x13] = '\0';
          local_58[0x14] = '\0';
          local_58[0x15] = '\0';
          local_58[0x16] = '\0';
          local_58[0x17] = '\0';
          local_40 = qLcKmsDebug::category.name;
          QMessageLogger::debug
                    (local_58,"  type is BITMASK, value is %llu, possible bits are:",__args_1);
        }
        lVar7 = 8;
        for (uVar6 = 0; (long)uVar6 < (long)__args->count_enums; uVar6 = uVar6 + 1) {
          qLcKmsDebug();
          if (((byte)qLcKmsDebug::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) !=
              0) {
            local_58[0] = '\x02';
            local_58[1] = '\0';
            local_58[2] = '\0';
            local_58[3] = '\0';
            local_58[4] = '\0';
            local_58[5] = '\0';
            local_58[6] = '\0';
            local_58[7] = '\0';
            local_58[8] = '\0';
            local_58[9] = '\0';
            local_58[10] = '\0';
            local_58[0xb] = '\0';
            local_58[0xc] = '\0';
            local_58[0xd] = '\0';
            local_58[0xe] = '\0';
            local_58[0xf] = '\0';
            local_58[0x10] = '\0';
            local_58[0x11] = '\0';
            local_58[0x12] = '\0';
            local_58[0x13] = '\0';
            local_58[0x14] = '\0';
            local_58[0x15] = '\0';
            local_58[0x16] = '\0';
            local_58[0x17] = '\0';
            local_40 = qLcKmsDebug::category.name;
            QMessageLogger::debug
                      (local_58,"    bitmask %d: %s - %u",uVar6 & 0xffffffff,
                       __args->enums->name + lVar7 + -8,
                       (ulong)(uint)(1 << (__args->enums->name[lVar7 + -0x10] & 0x1fU)));
          }
          lVar7 = lVar7 + 0x28;
        }
      }
      else if ((uVar1 & 0xffd0) == 0x10) {
        qLcKmsDebug();
        if (((byte)qLcKmsDebug::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0)
        {
          pcVar5 = "  type is BLOB";
LAB_00110947:
          local_58[0x14] = '\0';
          local_58[0x15] = '\0';
          local_58[0x16] = '\0';
          local_58[0x17] = '\0';
          local_58[0xc] = '\0';
          local_58[0xd] = '\0';
          local_58[0xe] = '\0';
          local_58[0xf] = '\0';
          local_58[0x10] = '\0';
          local_58[0x11] = '\0';
          local_58[0x12] = '\0';
          local_58[0x13] = '\0';
          local_58[4] = '\0';
          local_58[5] = '\0';
          local_58[6] = '\0';
          local_58[7] = '\0';
          local_58[8] = '\0';
          local_58[9] = '\0';
          local_58[10] = '\0';
          local_58[0xb] = '\0';
          local_58[0] = '\x02';
          local_58[1] = '\0';
          local_58[2] = '\0';
          local_58[3] = '\0';
          local_40 = qLcKmsDebug::category.name;
          QMessageLogger::debug(local_58,pcVar5);
        }
      }
      else {
        bVar3 = uVar2 == 0x40;
        if (uVar2 == 0) {
          bVar3 = SUB41((uVar1 & 0x40) >> 6,0);
        }
        if (bVar3 == true) {
          qLcKmsDebug();
          if (((byte)qLcKmsDebug::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) !=
              0) {
            pcVar5 = "  type is OBJECT";
            goto LAB_00110947;
          }
        }
      }
      std::function<void_(_drmModeProperty_*,_unsigned_long_long)>::operator()
                (in_RDX,__args,__args_1);
      drmModeFreeProperty(__args);
    }
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

void QKmsDevice::enumerateProperties(drmModeObjectPropertiesPtr objProps, PropCallback callback)
{
    for (uint32_t propIdx = 0; propIdx < objProps->count_props; ++propIdx) {
        drmModePropertyPtr prop = drmModeGetProperty(m_dri_fd, objProps->props[propIdx]);
        if (!prop)
            continue;

        const quint64 value = objProps->prop_values[propIdx];
        qCDebug(qLcKmsDebug, "  property %d: id = %u name = '%s'", propIdx, prop->prop_id, prop->name);

        if (propTypeIs(prop, DRM_MODE_PROP_SIGNED_RANGE)) {
            qCDebug(qLcKmsDebug, "  type is SIGNED_RANGE, value is %lld, possible values are:", qint64(value));
            for (int i = 0; i < prop->count_values; ++i)
                qCDebug(qLcKmsDebug, "    %lld", qint64(prop->values[i]));
        } else if (propTypeIs(prop, DRM_MODE_PROP_RANGE)) {
            qCDebug(qLcKmsDebug, "  type is RANGE, value is %llu, possible values are:", value);
            for (int i = 0; i < prop->count_values; ++i)
                qCDebug(qLcKmsDebug, "    %llu", quint64(prop->values[i]));
        } else if (propTypeIs(prop, DRM_MODE_PROP_ENUM)) {
            qCDebug(qLcKmsDebug, "  type is ENUM, value is %llu, possible values are:", value);
            for (int i = 0; i < prop->count_enums; ++i)
                qCDebug(qLcKmsDebug, "    enum %d: %s - %llu", i, prop->enums[i].name, quint64(prop->enums[i].value));
        } else if (propTypeIs(prop, DRM_MODE_PROP_BITMASK)) {
            qCDebug(qLcKmsDebug, "  type is BITMASK, value is %llu, possible bits are:", value);
            for (int i = 0; i < prop->count_enums; ++i)
                qCDebug(qLcKmsDebug, "    bitmask %d: %s - %u", i, prop->enums[i].name, 1 << prop->enums[i].value);
        } else if (propTypeIs(prop, DRM_MODE_PROP_BLOB)) {
            qCDebug(qLcKmsDebug, "  type is BLOB");
        } else if (propTypeIs(prop, DRM_MODE_PROP_OBJECT)) {
            qCDebug(qLcKmsDebug, "  type is OBJECT");
        }

        callback(prop, value);

        drmModeFreeProperty(prop);
    }
}